

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateSequenceInfo::Deserialize(CreateSequenceInfo *this,Deserializer *deserializer)

{
  CreateSequenceInfo *this_00;
  pointer pCVar1;
  _Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false> local_20;
  
  this_00 = (CreateSequenceInfo *)operator_new(0x178);
  CreateSequenceInfo(this_00);
  local_20._M_head_impl = this_00;
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(deserializer,200,"name",&pCVar1->name)
  ;
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"usage_count",&pCVar1->usage_count);
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<long>(deserializer,0xca,"increment",&pCVar1->increment);
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<long>(deserializer,0xcb,"min_value",&pCVar1->min_value);
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<long>(deserializer,0xcc,"max_value",&pCVar1->max_value);
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<long>(deserializer,0xcd,"start_value",&pCVar1->start_value);
  pCVar1 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xce,"cycle",&pCVar1->cycle);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateSequenceInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CreateSequenceInfo>(new CreateSequenceInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadPropertyWithDefault<uint64_t>(201, "usage_count", result->usage_count);
	deserializer.ReadPropertyWithDefault<int64_t>(202, "increment", result->increment);
	deserializer.ReadPropertyWithDefault<int64_t>(203, "min_value", result->min_value);
	deserializer.ReadPropertyWithDefault<int64_t>(204, "max_value", result->max_value);
	deserializer.ReadPropertyWithDefault<int64_t>(205, "start_value", result->start_value);
	deserializer.ReadPropertyWithDefault<bool>(206, "cycle", result->cycle);
	return std::move(result);
}